

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall
CLI::Option_group::Option_group
          (Option_group *this,string *group_description,string *group_name,App *parent)

{
  allocator<char> local_da;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::__cxx11::string::string
            (&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)group_description)
  ;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"",(allocator<char> *)&local_d8);
  App::App(&this->super_App,(string *)&local_38,&local_58,parent);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  (this->super_App)._vptr_App = (_func_int **)&PTR__App_004bc8c0;
  ::std::__cxx11::string::string
            ((string *)&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)group_name);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->super_App).group_,&local_78);
  ::std::__cxx11::string::~string((string *)&local_78);
  if ((group_name->_M_string_length == 0) || (*(group_name->_M_dataplus)._M_p == '+')) {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_d9);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_da);
    App::set_help_flag(&this->super_App,&local_98,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_d9);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_da);
    App::set_help_all_flag(&this->super_App,&local_b8,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_b8);
  }
  return;
}

Assistant:

Option_group(std::string group_description, std::string group_name, App *parent)
        : App(std::move(group_description), "", parent) {
        group(group_name);
        // option groups should have automatic fallthrough
        if(group_name.empty() || group_name.front() == '+') {
            // help will not be used by default in these contexts
            set_help_flag("");
            set_help_all_flag("");
        }
    }